

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

int Llb_NonlinCompPerms(DdManager *dd,int *pVar2Lev)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  if (0 < (long)dd->size) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar3 = dd->perm[lVar2];
      if (dd->subtables[iVar3].keys != dd->subtables[iVar3].dead + 1) {
        iVar3 = iVar3 - pVar2Lev[lVar2];
        iVar4 = -iVar3;
        if (0 < iVar3) {
          iVar4 = iVar3;
        }
        iVar1 = iVar1 + iVar4;
      }
      lVar2 = lVar2 + 1;
    } while (dd->size != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Llb_NonlinCompPerms( DdManager * dd, int * pVar2Lev )
{
    DdSubtable * pSubt;
    int i, Sum = 0, Entry;
    for ( i = 0; i < dd->size; i++ )
    {
        pSubt = &(dd->subtables[dd->perm[i]]);
        if ( pSubt->keys == pSubt->dead + 1 )
            continue;
        Entry = Abc_MaxInt(dd->perm[i], pVar2Lev[i]) - Abc_MinInt(dd->perm[i], pVar2Lev[i]);
        Sum += Entry;
//printf( "%d-%d(%d) ", dd->perm[i], pV2L[i], Entry );
    }
    return Sum;
}